

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void armci_msg_bcast(void *buf,int len,int root)

{
  undefined8 in_RAX;
  MPI_Comm poVar1;
  ARMCI_Group group;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  if (buf != (void *)0x0) {
    comex_barrier(ARMCI_Default_Proc_Group);
    ARMCI_Group_get_default((ARMCI_Group *)&local_24);
    poVar1 = get_comm((ARMCI_Group *)(ulong)local_24);
    MPI_Bcast(buf,len,&ompi_mpi_byte,root,poVar1);
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0xe6,"void armci_msg_bcast(void *, int, int)");
}

Assistant:

void armci_msg_bcast(void *buf, int len, int root)
{
    assert(buf != NULL);
    comex_barrier(ARMCI_Default_Proc_Group);
    MPI_Bcast(buf, len, MPI_BYTE, root, get_default_comm());
}